

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O1

void luaL_setfuncs(lua_State *L,luaL_Reg *l,int nup)

{
  luaL_Reg *plVar1;
  int iVar2;
  
  luaL_checkstack(L,nup,"too many upvalues");
  if (l->name != (char *)0x0) {
    do {
      iVar2 = nup;
      if (0 < nup) {
        do {
          lua_pushvalue(L,-nup);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      lua_pushcclosure(L,l->func,nup);
      lua_setfield(L,-2 - nup,l->name);
      plVar1 = l + 1;
      l = l + 1;
    } while (plVar1->name != (char *)0x0);
  }
  lua_settop(L,~nup);
  return;
}

Assistant:

LUALIB_API void luaL_setfuncs(lua_State *L, const luaL_Reg *l, int nup)
{
  luaL_checkstack(L, nup, "too many upvalues");
  for (; l->name; l++) {
    int i;
    for (i = 0; i < nup; i++)  /* Copy upvalues to the top. */
      lua_pushvalue(L, -nup);
    lua_pushcclosure(L, l->func, nup);
    lua_setfield(L, -(nup + 2), l->name);
  }
  lua_pop(L, nup);  /* Remove upvalues. */
}